

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpo.c
# Opt level: O1

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t **edges,int edgeCount,int *vertexDegree)

{
  Rpo_LCI_Edge_t RVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  uint uVar7;
  ulong uVar8;
  
  if (0 < edgeCount) {
    uVar2 = 0xffffffff;
    uVar3 = 0;
    iVar5 = -1;
    uVar4 = 0xffffffff;
    do {
      RVar1 = *edges[uVar3];
      if (((ulong)RVar1 & 1) == 0) {
        uVar7 = (uint)((ulong)RVar1 >> 4);
        uVar8 = (ulong)(uVar7 & 0x3fffffff);
        uVar6 = (ulong)RVar1 >> 0x22;
        uVar7 = vertexDegree[uVar6] + *(int *)((long)vertexDegree + (ulong)(uVar7 << 2));
        if (uVar8 < uVar6) {
          uVar6 = uVar8;
        }
        if ((uVar7 < uVar4) || ((uVar7 == uVar4 && ((int)uVar6 < iVar5)))) {
          uVar2 = uVar3 & 0xffffffff;
          uVar4 = uVar7;
          iVar5 = (int)uVar6;
        }
      }
      uVar3 = uVar3 + 1;
    } while ((uint)edgeCount != uVar3);
    return (int)uVar2;
  }
  return -1;
}

Assistant:

int Rpo_computeMinEdgeCost(Rpo_LCI_Edge_t** edges, int edgeCount, int* vertexDegree) {
    int minCostIndex = -1;
    int minVertexIndex = -1;
    unsigned int minCost = ~0;
    Rpo_LCI_Edge_t* edge;
    unsigned int edgeCost;
    int minVertex;
    int i;
    for (i = 0; i < edgeCount; ++i) {
        edge = edges[i];
        if (!edge->visited) {
            edgeCost = vertexDegree[edge->idx1] + vertexDegree[edge->idx2];
            minVertex = (edge->idx1 < edge->idx2) ? edge->idx1 : edge->idx2;
            if (edgeCost < minCost) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            } else if ((edgeCost == minCost) && minVertex < minVertexIndex) {
                minCost = edgeCost;
                minCostIndex = i;
                minVertexIndex = minVertex;
            }
        }
    }
    return minCostIndex;
}